

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isVolumePartition(iso9660 *iso9660,uchar *h)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int32_t location;
  uchar *h_local;
  iso9660 *iso9660_local;
  
  if (*h == '\x03') {
    if (h[6] == '\x01') {
      if (h[7] == '\0') {
        uVar1 = archive_le32dec(h + 0x48);
        if (((int)uVar1 < 0x11) || (iso9660->volume_block <= (int)uVar1)) {
          iso9660_local._4_4_ = 0;
        }
        else {
          uVar2 = archive_be32dec(h + 0x4c);
          if (uVar1 == uVar2) {
            iso9660_local._4_4_ = 1;
          }
          else {
            iso9660_local._4_4_ = 0;
          }
        }
      }
      else {
        iso9660_local._4_4_ = 0;
      }
    }
    else {
      iso9660_local._4_4_ = 0;
    }
  }
  else {
    iso9660_local._4_4_ = 0;
  }
  return iso9660_local._4_4_;
}

Assistant:

static int
isVolumePartition(struct iso9660 *iso9660, const unsigned char *h)
{
	int32_t location;

	/* Type of the Volume Partition Descriptor must be 3. */
	if (h[0] != 3)
		return (0);

	/* Volume Descriptor Version must be 1. */
	if (h[6] != 1)
		return (0);
	/* Unused Field */
	if (h[7] != 0)
		return (0);

	location = archive_le32dec(h + 72);
	if (location <= SYSTEM_AREA_BLOCK ||
	    location >= iso9660->volume_block)
		return (0);
	if ((uint32_t)location != archive_be32dec(h + 76))
		return (0);

	return (1);
}